

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_channel_converter_process_pcm_frames__mono_in
                    (ma_channel_converter *pConverter,void *pFramesOut,void *pFramesIn,
                    ma_uint64 frameCount)

{
  long lVar1;
  ma_uint8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  ma_uint8 *pFramesInU8;
  ma_uint8 *pFramesOutU8;
  ma_uint64 iFrame;
  uint local_b4;
  uint local_9c;
  ma_uint32 iChannel_4;
  float *pFramesInF32;
  float *pFramesOutF32;
  ma_uint32 iChannel_3;
  ma_int32 *pFramesInS32;
  ma_int32 *pFramesOutS32;
  ma_uint64 iSampleIn;
  ma_uint64 iSampleOut;
  ma_uint32 iChannel_2;
  ma_uint8 *pFramesInS24;
  ma_uint8 *pFramesOutS24;
  ma_uint32 iChannel_1;
  ma_int16 *pFramesInS16;
  ma_int16 *pFramesOutS16;
  ma_uint32 iChannel;
  
  switch(*in_RDI) {
  case 1:
    for (pFramesInS24 = (ma_uint8 *)0x0; pFramesInS24 < in_RCX; pFramesInS24 = pFramesInS24 + 1) {
      for (iSampleIn._4_4_ = 0; iSampleIn._4_4_ < (uint)in_RDI[2];
          iSampleIn._4_4_ = iSampleIn._4_4_ + 1) {
        *(ma_uint8 *)(in_RSI + (long)pFramesInS24 * (ulong)(uint)in_RDI[2] + (ulong)iSampleIn._4_4_)
             = pFramesInS24[in_RDX];
      }
    }
    break;
  case 2:
    if (in_RDI[2] == 2) {
      for (pFramesInS24 = (ma_uint8 *)0x0; pFramesInS24 < in_RCX; pFramesInS24 = pFramesInS24 + 1) {
        *(undefined2 *)(in_RSI + (long)pFramesInS24 * 4) =
             *(undefined2 *)(in_RDX + (long)pFramesInS24 * 2);
        *(undefined2 *)(in_RSI + 2 + (long)pFramesInS24 * 4) =
             *(undefined2 *)(in_RDX + (long)pFramesInS24 * 2);
      }
    }
    else {
      for (pFramesInS24 = (ma_uint8 *)0x0; pFramesInS24 < in_RCX; pFramesInS24 = pFramesInS24 + 1) {
        for (iChannel_3 = 0; iChannel_3 < (uint)in_RDI[2]; iChannel_3 = iChannel_3 + 1) {
          *(undefined2 *)
           (in_RSI + ((long)pFramesInS24 * (ulong)(uint)in_RDI[2] + (ulong)iChannel_3) * 2) =
               *(undefined2 *)(in_RDX + (long)pFramesInS24 * 2);
        }
      }
    }
    break;
  case 3:
    for (pFramesInS24 = (ma_uint8 *)0x0; pFramesInS24 < in_RCX; pFramesInS24 = pFramesInS24 + 1) {
      for (iChannel_4 = 0; iChannel_4 < (uint)in_RDI[2]; iChannel_4 = iChannel_4 + 1) {
        lVar1 = (long)pFramesInS24 * (ulong)(uint)in_RDI[2] + (ulong)iChannel_4;
        *(undefined1 *)(in_RSI + lVar1 * 3) = *(undefined1 *)(in_RDX + (long)pFramesInS24 * 3);
        *(undefined1 *)(in_RSI + 1 + lVar1 * 3) =
             *(undefined1 *)(in_RDX + 1 + (long)pFramesInS24 * 3);
        *(undefined1 *)(in_RSI + 2 + lVar1 * 3) =
             *(undefined1 *)(in_RDX + 2 + (long)pFramesInS24 * 3);
      }
    }
    break;
  case 4:
    for (pFramesInS24 = (ma_uint8 *)0x0; pFramesInS24 < in_RCX; pFramesInS24 = pFramesInS24 + 1) {
      for (local_9c = 0; local_9c < (uint)in_RDI[2]; local_9c = local_9c + 1) {
        *(undefined4 *)
         (in_RSI + ((long)pFramesInS24 * (ulong)(uint)in_RDI[2] + (ulong)local_9c) * 4) =
             *(undefined4 *)(in_RDX + (long)pFramesInS24 * 4);
      }
    }
    break;
  case 5:
    if (in_RDI[2] == 2) {
      for (pFramesInS24 = (ma_uint8 *)0x0; pFramesInS24 < in_RCX; pFramesInS24 = pFramesInS24 + 1) {
        *(undefined4 *)(in_RSI + (long)pFramesInS24 * 8) =
             *(undefined4 *)(in_RDX + (long)pFramesInS24 * 4);
        *(undefined4 *)(in_RSI + 4 + (long)pFramesInS24 * 8) =
             *(undefined4 *)(in_RDX + (long)pFramesInS24 * 4);
      }
    }
    else {
      for (pFramesInS24 = (ma_uint8 *)0x0; pFramesInS24 < in_RCX; pFramesInS24 = pFramesInS24 + 1) {
        for (local_b4 = 0; local_b4 < (uint)in_RDI[2]; local_b4 = local_b4 + 1) {
          *(undefined4 *)
           (in_RSI + ((long)pFramesInS24 * (ulong)(uint)in_RDI[2] + (ulong)local_b4) * 4) =
               *(undefined4 *)(in_RDX + (long)pFramesInS24 * 4);
        }
      }
    }
    break;
  default:
    return MA_INVALID_OPERATION;
  }
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_channel_converter_process_pcm_frames__mono_in(ma_channel_converter* pConverter, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint64 iFrame;

    MA_ASSERT(pConverter != NULL);
    MA_ASSERT(pFramesOut != NULL);
    MA_ASSERT(pFramesIn  != NULL);
    MA_ASSERT(pConverter->channelsIn == 1);

    switch (pConverter->format)
    {
        case ma_format_u8:
        {
            /* */ ma_uint8* pFramesOutU8 = (      ma_uint8*)pFramesOut;
            const ma_uint8* pFramesInU8  = (const ma_uint8*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                ma_uint32 iChannel;
                for (iChannel = 0; iChannel < pConverter->channelsOut; iChannel += 1) {
                    pFramesOutU8[iFrame*pConverter->channelsOut + iChannel] = pFramesInU8[iFrame];
                }
            }
        } break;

        case ma_format_s16:
        {
            /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
            const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

            if (pConverter->channelsOut == 2) {
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    pFramesOutS16[iFrame*2 + 0] = pFramesInS16[iFrame];
                    pFramesOutS16[iFrame*2 + 1] = pFramesInS16[iFrame];
                }
            } else {
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    ma_uint32 iChannel;
                    for (iChannel = 0; iChannel < pConverter->channelsOut; iChannel += 1) {
                        pFramesOutS16[iFrame*pConverter->channelsOut + iChannel] = pFramesInS16[iFrame];
                    }
                }
            }
        } break;

        case ma_format_s24:
        {
            /* */ ma_uint8* pFramesOutS24 = (      ma_uint8*)pFramesOut;
            const ma_uint8* pFramesInS24  = (const ma_uint8*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                ma_uint32 iChannel;
                for (iChannel = 0; iChannel < pConverter->channelsOut; iChannel += 1) {
                    ma_uint64 iSampleOut = iFrame*pConverter->channelsOut + iChannel;
                    ma_uint64 iSampleIn  = iFrame;
                    pFramesOutS24[iSampleOut*3 + 0] = pFramesInS24[iSampleIn*3 + 0];
                    pFramesOutS24[iSampleOut*3 + 1] = pFramesInS24[iSampleIn*3 + 1];
                    pFramesOutS24[iSampleOut*3 + 2] = pFramesInS24[iSampleIn*3 + 2];
                }
            }
        } break;

        case ma_format_s32:
        {
            /* */ ma_int32* pFramesOutS32 = (      ma_int32*)pFramesOut;
            const ma_int32* pFramesInS32  = (const ma_int32*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                ma_uint32 iChannel;
                for (iChannel = 0; iChannel < pConverter->channelsOut; iChannel += 1) {
                    pFramesOutS32[iFrame*pConverter->channelsOut + iChannel] = pFramesInS32[iFrame];
                }
            }
        } break;

        case ma_format_f32:
        {
            /* */ float* pFramesOutF32 = (      float*)pFramesOut;
            const float* pFramesInF32  = (const float*)pFramesIn;

            if (pConverter->channelsOut == 2) {
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    pFramesOutF32[iFrame*2 + 0] = pFramesInF32[iFrame];
                    pFramesOutF32[iFrame*2 + 1] = pFramesInF32[iFrame];
                }
            } else {
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    ma_uint32 iChannel;
                    for (iChannel = 0; iChannel < pConverter->channelsOut; iChannel += 1) {
                        pFramesOutF32[iFrame*pConverter->channelsOut + iChannel] = pFramesInF32[iFrame];
                    }
                }
            }
        } break;

        default: return MA_INVALID_OPERATION;   /* Unknown format. */
    }

    return MA_SUCCESS;
}